

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O0

void anon_unknown.dwarf_30b7b8::handle_begin
               (Attribute *attr,Variant *value,int prop,Blackboard *blackboard,MetadataTree *tree)

{
  MetadataTree *this;
  Variant *val;
  Variant *attr_00;
  cali_id_t key_00;
  Node *pNVar1;
  Entry local_80;
  undefined1 local_68 [8];
  Entry entry;
  cali_id_t key;
  MetadataTree *local_30;
  MetadataTree *tree_local;
  Blackboard *blackboard_local;
  Variant *pVStack_18;
  int prop_local;
  Variant *value_local;
  Attribute *attr_local;
  
  local_30 = tree;
  tree_local = (MetadataTree *)blackboard;
  blackboard_local._4_4_ = prop;
  pVStack_18 = value;
  value_local = (Variant *)attr;
  if ((prop & 1U) == 0) {
    entry.m_value.m_v.value.v_uint = get_blackboard_key_for_reference_entry(prop);
    attr_00 = value_local;
    val = pVStack_18;
    this = local_30;
    cali::Blackboard::get(&local_80,(Blackboard *)tree_local,entry.m_value.m_v.value.v_uint);
    pNVar1 = cali::Entry::node(&local_80);
    pNVar1 = cali::internal::MetadataTree::get_child(this,(Attribute *)attr_00,val,pNVar1);
    cali::Entry::Entry((Entry *)local_68,pNVar1);
    cali::Blackboard::set
              ((Blackboard *)tree_local,entry.m_value.m_v.value.v_uint,(Entry *)local_68,
               (bool)(((blackboard_local._4_4_ & 0x80) != 0 ^ 0xffU) & 1));
  }
  else {
    key_00 = cali::Attribute::id(attr);
    cali::Entry::Entry((Entry *)&key,(Attribute *)value_local,pVStack_18);
    cali::Blackboard::set
              (blackboard,key_00,(Entry *)&key,
               (bool)(((blackboard_local._4_4_ & 0x80) != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

inline void handle_begin(
    const Attribute& attr,
    const Variant&   value,
    int              prop,
    Blackboard&      blackboard,
    MetadataTree&    tree
)
{
    if (prop & CALI_ATTR_ASVALUE) {
        blackboard.set(attr.id(), Entry(attr, value), !(prop & CALI_ATTR_HIDDEN));
    } else {
        cali_id_t key   = get_blackboard_key_for_reference_entry(prop);
        Entry     entry = Entry(tree.get_child(attr, value, blackboard.get(key).node()));
        blackboard.set(key, entry, !(prop & CALI_ATTR_HIDDEN));
    }
}